

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow *window,ImGuiViewportP *viewport)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiViewportP *pIVar3;
  ImGuiWindow *pIVar4;
  ImGuiViewportP *pIVar5;
  ImGuiWindow **ppIVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  ushort uVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  long lVar12;
  uint uVar13;
  int n;
  long lVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  
  pIVar10 = GImGui;
  if (((viewport->super_ImGuiViewport).Flags & 0x280) == 0) {
    return false;
  }
  pIVar3 = window->Viewport;
  if (pIVar3 != viewport) {
    fVar20 = (window->Pos).x;
    fVar21 = (window->Pos).y;
    IVar1 = (viewport->super_ImGuiViewport).Pos;
    fVar18 = IVar1.x;
    if (fVar20 < fVar18) {
      return false;
    }
    fVar19 = IVar1.y;
    uVar9 = -(ushort)(fVar19 <= fVar21);
    if ((uVar9 & 1) == 0) {
      return false;
    }
    IVar1 = (viewport->super_ImGuiViewport).Size;
    fVar22 = (window->Size).x + fVar20;
    fVar23 = (window->Size).y + fVar21;
    iVar15 = -(uint)(fVar22 <= fVar18 + IVar1.x);
    iVar16 = -(uint)(fVar23 <= fVar19 + IVar1.y);
    auVar7._4_4_ = iVar15;
    auVar7._0_4_ = iVar15;
    auVar7._8_4_ = iVar16;
    auVar7._12_4_ = iVar16;
    uVar13 = movmskpd((uint)uVar9,auVar7);
    if ((uVar13 & 1) == 0) {
      return false;
    }
    if ((byte)((byte)uVar13 >> 1) == 0) {
      return false;
    }
    bVar11 = GetWindowAlwaysWantOwnViewport(window);
    if (!bVar11) {
      iVar15 = (pIVar10->Windows).Size;
      lVar12 = (long)iVar15;
      if (0 < lVar12) {
        lVar14 = 0;
        do {
          pIVar4 = (pIVar10->Windows).Data[lVar14];
          if (pIVar4 == window) break;
          if (((pIVar4->WasActive == true) && (pIVar4->ViewportOwned == true)) &&
             ((pIVar4->Flags & 0x1000000) == 0)) {
            pIVar5 = pIVar4->Viewport;
            IVar1 = (pIVar5->super_ImGuiViewport).Pos;
            IVar2 = (pIVar5->super_ImGuiViewport).Size;
            fVar18 = IVar1.x;
            fVar19 = IVar1.y;
            iVar16 = -(uint)(fVar20 < IVar2.x + fVar18);
            iVar17 = -(uint)(fVar21 < IVar2.y + fVar19);
            auVar8._4_4_ = iVar16;
            auVar8._0_4_ = iVar16;
            auVar8._8_4_ = iVar17;
            auVar8._12_4_ = iVar17;
            uVar13 = movmskpd((int)pIVar5,auVar8);
            if ((((uVar13 & 2) != 0) && (fVar19 < fVar23)) &&
               (((uVar13 & 1) != 0 && (fVar18 < fVar22)))) {
              return false;
            }
          }
          lVar14 = lVar14 + 1;
        } while (lVar12 != lVar14);
        if ((0 < iVar15) && (window->ViewportOwned != false)) {
          ppIVar6 = (pIVar10->Windows).Data;
          lVar14 = 0;
          do {
            pIVar4 = ppIVar6[lVar14];
            if (pIVar4->Viewport == pIVar3) {
              pIVar4->Viewport = viewport;
              pIVar4->ViewportId = (viewport->super_ImGuiViewport).ID;
              pIVar4->ViewportOwned = viewport->Window == pIVar4;
            }
            lVar14 = lVar14 + 1;
          } while (lVar12 != lVar14);
        }
      }
      window->Viewport = viewport;
      window->ViewportId = (viewport->super_ImGuiViewport).ID;
      window->ViewportOwned = viewport->Window == window;
      BringWindowToDisplayFront(window);
      return true;
    }
  }
  return false;
}

Assistant:

static bool ImGui::UpdateTryMergeWindowIntoHostViewport(ImGuiWindow* window, ImGuiViewportP* viewport)
{
    ImGuiContext& g = *GImGui;
    if (!(viewport->Flags & (ImGuiViewportFlags_CanHostOtherWindows | ImGuiViewportFlags_Minimized)) || window->Viewport == viewport)
        return false;
    if (!viewport->GetRect().Contains(window->Rect()))
        return false;
    if (GetWindowAlwaysWantOwnViewport(window))
        return false;

    for (int n = 0; n < g.Windows.Size; n++)
    {
        ImGuiWindow* window_behind = g.Windows[n];
        if (window_behind == window)
            break;
        if (window_behind->WasActive && window_behind->ViewportOwned && !(window_behind->Flags & ImGuiWindowFlags_ChildWindow))
            if (window_behind->Viewport->GetRect().Overlaps(window->Rect()))
                return false;
    }

    // Move to the existing viewport, Move child/hosted windows as well (FIXME-OPT: iterate child)
    ImGuiViewportP* old_viewport = window->Viewport;
    if (window->ViewportOwned)
        for (int n = 0; n < g.Windows.Size; n++)
            if (g.Windows[n]->Viewport == old_viewport)
                SetWindowViewport(g.Windows[n], viewport);
    SetWindowViewport(window, viewport);
    BringWindowToDisplayFront(window);

    return true;
}